

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

int __thiscall rlist::match(rlist *this,void *ptr,void *key)

{
  __type_conflict _Var1;
  
  _Var1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           ((long)ptr + 0x10),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key);
  return (int)_Var1;
}

Assistant:

int rlist::match(void *ptr,void *key){
    return (*(static_cast<std::string*>(((listNode *)ptr)->value))==*(static_cast<std::string*>(key)))?1:0;
}